

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O3

void __thiscall Potassco::RuleBuilder::startBody(RuleBuilder *this,Body_t bt,Weight_t bnd)

{
  uint uVar1;
  Weight_t *pWVar2;
  uint *puVar3;
  uint uVar4;
  
  puVar3 = (uint *)(this->mem_).beg_;
  uVar4 = *puVar3;
  if ((int)uVar4 < 0) {
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    *puVar3 = 0x14;
    uVar4 = 0x14;
  }
  else if (puVar3[4] != 0) {
    if (puVar3[4] == (puVar3[3] & 0x3fffffff)) {
      return;
    }
    fail(-1,"void Potassco::RuleBuilder::startBody(Body_t, Weight_t)",0x91,"r->body.len() == 0",
         "Invalid second call to startBody()",0);
  }
  if (bt.val_ != Normal) {
    uVar1 = uVar4 + 4;
    if ((ulong)((long)(this->mem_).end_ - (long)(this->mem_).beg_) < (ulong)uVar1) {
      MemoryRegion::grow(&this->mem_,(ulong)uVar1);
      puVar3 = (uint *)(this->mem_).beg_;
    }
    pWVar2 = (Weight_t *)MemoryRegion::operator[](&this->mem_,(ulong)uVar4);
    *pWVar2 = bnd;
    uVar4 = *puVar3 & 0x80000000 | uVar1 & 0x7fffffff;
    *puVar3 = uVar4;
  }
  puVar3[4] = uVar4 & 0x7fffffff;
  puVar3[3] = bt.val_ << 0x1e | uVar4 & 0x3fffffff;
  return;
}

Assistant:

void RuleBuilder::startBody(Body_t bt, Weight_t bnd) {
	Rule* r = unfreeze(true);
	if (!r->body.mend) {
		if (bt != Body_t::Normal) { r = push(mem_, r, bnd); }
		r->body.init(r->top, bt);
	}
	else {
		POTASSCO_ASSERT(r->body.len() == 0, "Invalid second call to startBody()");
	}
}